

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitBooleanExpression
               (ParseNode *expr,ByteCodeLabel trueLabel,ByteCodeLabel falseLabel,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,bool trueFallthrough,
               bool falseFallthrough)

{
  OpCode OVar1;
  OpCode op;
  RegSlot R1;
  ParseNode *pnode1;
  code *pcVar2;
  bool bVar3;
  ByteCodeLabel BVar4;
  undefined4 *puVar5;
  ulong uVar6;
  ParseNodeBin *pPVar7;
  ParseNodeUni *pPVar8;
  ParseNodePtr pPVar9;
  
  if (trueFallthrough && falseFallthrough) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x245d,"(!trueFallthrough || !falseFallthrough)",
                       "!trueFallthrough || !falseFallthrough");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  ByteCodeGenerator::StartStatement(byteCodeGenerator,expr);
  OVar1 = expr->nop;
  uVar6 = (ulong)OVar1;
  if (OVar1 < knopEq) {
    if (OVar1 == knopFalse) goto joined_r0x00820d97;
    if (OVar1 != knopTrue) {
      if (OVar1 != knopLogNot) goto LAB_00820e6b;
      pPVar8 = ParseNode::AsParseNodeUni(expr);
      EmitBooleanExpression
                (pPVar8->pnode1,falseLabel,trueLabel,byteCodeGenerator,funcInfo,falseFallthrough,
                 trueFallthrough);
      pPVar8 = ParseNode::AsParseNodeUni(expr);
      pPVar9 = pPVar8->pnode1;
      goto LAB_00820e46;
    }
    if (trueFallthrough) goto LAB_00820e4e;
  }
  else {
    if (OVar1 < knopCoalesce) {
      if ((0x307e0000000000U >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 == 0x37) {
          BVar4 = Js::ByteCodeWriter::DefineLabel(&byteCodeGenerator->m_writer);
          pPVar7 = ParseNode::AsParseNodeBin(expr);
          EmitBooleanExpression
                    (pPVar7->pnode1,trueLabel,BVar4,byteCodeGenerator,funcInfo,false,true);
          pPVar7 = ParseNode::AsParseNodeBin(expr);
          FuncInfo::ReleaseLoc(funcInfo,pPVar7->pnode1);
          Js::ByteCodeWriter::MarkLabel(&byteCodeGenerator->m_writer,BVar4);
          pPVar7 = ParseNode::AsParseNodeBin(expr);
          pPVar9 = pPVar7->pnode2;
        }
        else {
          if (uVar6 != 0x38) goto LAB_00820e6b;
          BVar4 = Js::ByteCodeWriter::DefineLabel(&byteCodeGenerator->m_writer);
          pPVar7 = ParseNode::AsParseNodeBin(expr);
          EmitBooleanExpression
                    (pPVar7->pnode1,BVar4,falseLabel,byteCodeGenerator,funcInfo,true,false);
          pPVar7 = ParseNode::AsParseNodeBin(expr);
          FuncInfo::ReleaseLoc(funcInfo,pPVar7->pnode1);
          Js::ByteCodeWriter::MarkLabel(&byteCodeGenerator->m_writer,BVar4);
          pPVar7 = ParseNode::AsParseNodeBin(expr);
          pPVar9 = pPVar7->pnode2;
        }
        EmitBooleanExpression
                  (pPVar9,trueLabel,falseLabel,byteCodeGenerator,funcInfo,trueFallthrough,
                   falseFallthrough);
        pPVar7 = ParseNode::AsParseNodeBin(expr);
        pPVar9 = pPVar7->pnode2;
LAB_00820e46:
        FuncInfo::ReleaseLoc(funcInfo,pPVar9);
        goto LAB_00820e4e;
      }
      pPVar7 = ParseNode::AsParseNodeBin(expr);
      pnode1 = pPVar7->pnode1;
      pPVar7 = ParseNode::AsParseNodeBin(expr);
      EmitBinaryOpnds(pnode1,pPVar7->pnode2,byteCodeGenerator,funcInfo,0xffffffff);
      pPVar7 = ParseNode::AsParseNodeBin(expr);
      FuncInfo::ReleaseLoc(funcInfo,pPVar7->pnode2);
      pPVar7 = ParseNode::AsParseNodeBin(expr);
      FuncInfo::ReleaseLoc(funcInfo,pPVar7->pnode1);
      op = nopToOp[expr->nop];
      pPVar7 = ParseNode::AsParseNodeBin(expr);
      R1 = pPVar7->pnode1->location;
      pPVar7 = ParseNode::AsParseNodeBin(expr);
      Js::ByteCodeWriter::BrReg2
                (&byteCodeGenerator->m_writer,op,trueLabel,R1,pPVar7->pnode2->location);
    }
    else {
LAB_00820e6b:
      Emit(expr,byteCodeGenerator,funcInfo,0,false,false);
      if (trueFallthrough) {
        Js::ByteCodeWriter::BrReg1(&byteCodeGenerator->m_writer,BrFalse_A,falseLabel,expr->location)
        ;
        goto LAB_00820e4e;
      }
      Js::ByteCodeWriter::BrReg1(&byteCodeGenerator->m_writer,BrTrue_A,trueLabel,expr->location);
    }
joined_r0x00820d97:
    trueLabel = falseLabel;
    if (falseFallthrough) goto LAB_00820e4e;
  }
  Js::ByteCodeWriter::Br(&byteCodeGenerator->m_writer,trueLabel);
LAB_00820e4e:
  Js::ByteCodeWriter::EndStatement(&byteCodeGenerator->m_writer,expr);
  return;
}

Assistant:

void EmitBooleanExpression(
    _In_ ParseNode* expr,
    Js::ByteCodeLabel trueLabel,
    Js::ByteCodeLabel falseLabel,
    _In_ ByteCodeGenerator* byteCodeGenerator,
    _In_ FuncInfo* funcInfo,
    bool trueFallthrough,
    bool falseFallthrough)
{
    Assert(!trueFallthrough || !falseFallthrough);

    byteCodeGenerator->StartStatement(expr);
    switch (expr->nop)
    {

    case knopLogOr:
    {
        Js::ByteCodeLabel leftFalse = byteCodeGenerator->Writer()->DefineLabel();
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode1, trueLabel, leftFalse, byteCodeGenerator, funcInfo, false, true);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftFalse);
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, falseLabel, byteCodeGenerator, funcInfo, trueFallthrough, falseFallthrough);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        break;
    }

    case knopLogAnd:
    {
        Js::ByteCodeLabel leftTrue = byteCodeGenerator->Writer()->DefineLabel();
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode1, leftTrue, falseLabel, byteCodeGenerator, funcInfo, true, false);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->MarkLabel(leftTrue);
        EmitBooleanExpression(expr->AsParseNodeBin()->pnode2, trueLabel, falseLabel, byteCodeGenerator, funcInfo, trueFallthrough, falseFallthrough);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        break;
    }

    case knopLogNot:
        EmitBooleanExpression(expr->AsParseNodeUni()->pnode1, falseLabel, trueLabel, byteCodeGenerator, funcInfo, falseFallthrough, trueFallthrough);
        funcInfo->ReleaseLoc(expr->AsParseNodeUni()->pnode1);
        break;

    case knopEq:
    case knopEqv:
    case knopNEqv:
    case knopNe:
    case knopLt:
    case knopLe:
    case knopGe:
    case knopGt:
        EmitBinaryOpnds(expr->AsParseNodeBin()->pnode1, expr->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode2);
        funcInfo->ReleaseLoc(expr->AsParseNodeBin()->pnode1);
        byteCodeGenerator->Writer()->BrReg2(nopToOp[expr->nop], trueLabel, expr->AsParseNodeBin()->pnode1->location,
            expr->AsParseNodeBin()->pnode2->location);
        if (!falseFallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        break;
    case knopTrue:
        if (!trueFallthrough)
        {
            byteCodeGenerator->Writer()->Br(trueLabel);
        }
        break;
    case knopFalse:
        if (!falseFallthrough)
        {
            byteCodeGenerator->Writer()->Br(falseLabel);
        }
        break;
    default:
        // Note: we usually release the temp assigned to a node after we Emit it.
        // But in this case, EmitBooleanExpression is just a wrapper around a normal Emit call,
        // and the caller of EmitBooleanExpression expects to be able to release this register.

        Emit(expr, byteCodeGenerator, funcInfo, false);
        if (trueFallthrough)
        {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, falseLabel, expr->location);
        }
        else
        {
            byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, trueLabel, expr->location);
            if (!falseFallthrough)
            {
                byteCodeGenerator->Writer()->Br(falseLabel);
            }
        }
        break;
    }

    byteCodeGenerator->EndStatement(expr);
}